

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O2

Address __thiscall
ParamListStandard::assignAddress
          (ParamListStandard *this,Datatype *tp,vector<int,_std::allocator<int>_> *status)

{
  long lVar1;
  long lVar2;
  long *in_RCX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  int4 j;
  long lVar6;
  Address AVar7;
  vector<int,_std::allocator<int>_> *pvVar3;
  
  paVar5 = &(tp->name).field_2;
  pvVar3 = status;
  paVar4 = paVar5;
  do {
    do {
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)paVar4->_M_allocated_capacity;
      if (paVar4 == paVar5) {
        (this->super_ParamList)._vptr_ParamList = (_func_int **)0x0;
        goto LAB_00292060;
      }
      lVar6 = (long)*(int *)((long)paVar4 + 0x18);
    } while ((*(int *)(*in_RCX + lVar6 * 4) < 0) ||
            ((*(int *)((long)paVar4 + 0x14) != 8 &&
             (*(int *)&status[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start != *(int *)((long)paVar4 + 0x14)))));
    AVar7 = ParamEntry::getAddrBySlot
                      ((ParamEntry *)this,(int4 *)paVar4[1]._M_local_buf,
                       (int)*in_RCX + *(int *)((long)paVar4 + 0x18) * 4);
    pvVar3 = (vector<int,_std::allocator<int>_> *)AVar7.offset;
  } while ((this->super_ParamList)._vptr_ParamList == (_func_int **)0x0);
  if (*(int *)((long)paVar4 + 0x38) == 0) {
    lVar2 = *(int *)((long)paVar4 + 0x1c) + lVar6;
    lVar1 = *in_RCX;
    for (; lVar6 < lVar2; lVar6 = lVar6 + 1) {
      *(undefined4 *)(lVar1 + lVar6 * 4) = 0xffffffff;
    }
  }
LAB_00292060:
  AVar7.offset = (uintb)pvVar3;
  AVar7.base = (AddrSpace *)this;
  return AVar7;
}

Assistant:

Address ParamListStandard::assignAddress(const Datatype *tp,vector<int4> &status) const

{
  list<ParamEntry>::const_iterator iter;
  for(iter=entry.begin();iter!=entry.end();++iter) {
    const ParamEntry &curEntry( *iter );
    int4 grp = curEntry.getGroup();
    if (status[grp]<0) continue;
    if ((curEntry.getType() != TYPE_UNKNOWN)&&
	tp->getMetatype() != curEntry.getType())
      continue;			// Wrong type

    Address res = curEntry.getAddrBySlot(status[grp],tp->getSize());
    if (res.isInvalid()) continue; // If -tp- doesn't fit an invalid address is returned
    if (curEntry.isExclusion()) {
      int4 maxgrp = grp + curEntry.getGroupSize();
      for(int4 j=grp;j<maxgrp;++j) // For an exclusion entry
	status[j] = -1;		// some number of groups are taken up
    }
    return res;
  }
  return Address();		// Return invalid address to indicated we could not assign anything
}